

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io.c++
# Opt level: O1

Promise<void> __thiscall
kj::anon_unknown_123::AsyncPipe::BlockedPumpTo::writeWithFds
          (BlockedPumpTo *this,ArrayPtr<const_unsigned_char> data,
          ArrayPtr<const_kj::ArrayPtr<const_unsigned_char>_> moreData,ArrayPtr<const_int> fds)

{
  undefined8 *puVar1;
  size_t __n;
  long in_R9;
  Array<const_kj::ArrayPtr<const_unsigned_char>_> result;
  undefined8 *__buf;
  long lVar2;
  long lVar3;
  long lVar4;
  undefined8 *puVar5;
  undefined8 *puVar6;
  size_t sVar7;
  
  if (in_R9 == 0) {
    write(this,(int)data.ptr,(void *)data.size_,(size_t)moreData.ptr);
  }
  else {
    puVar1 = (undefined8 *)
             kj::_::HeapArrayDisposer::allocateImpl
                       (0x10,0,in_R9 + 1,(_func_void_void_ptr *)0x0,(_func_void_void_ptr *)0x0);
    puVar5 = &kj::_::HeapArrayDisposer::instance;
    *puVar1 = (void *)data.size_;
    puVar1[1] = moreData.ptr;
    __buf = puVar1;
    memcpy(puVar1 + 2,(void *)moreData.size_,in_R9 * 0x10);
    __n = (long)((long)puVar1 + ((in_R9 * 0x10 + 0x10U) - (long)__buf)) >> 4;
    lVar2 = 0;
    lVar3 = 0;
    lVar4 = 0;
    puVar1 = puVar5;
    write(this,(int)data.ptr,__buf,__n);
    puVar6 = __buf;
    sVar7 = __n;
    if (__buf != (undefined8 *)0x0) {
      puVar6 = (undefined8 *)0x0;
      sVar7 = 0;
      (**(code **)*puVar5)(puVar5,__buf,0x10,__n,__n,0);
    }
    if (lVar2 != 0) {
      (**(code **)*puVar1)
                (puVar1,lVar2,0x10,lVar3 - lVar2 >> 4,lVar4 - lVar2 >> 4,0,0,0,0,puVar1,puVar6,sVar7
                );
    }
  }
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

Promise<void> writeWithFds(ArrayPtr<const byte> data,
                               ArrayPtr<const ArrayPtr<const byte>> moreData,
                               ArrayPtr<const int> fds) override {
      // Pumps drop all capabilities, so fall back to regular write().

      // TODO(cleaunp): After stream API refactor, regular write() methods will take
      //   (data, moreData) and we can clean this up.
      if (moreData.size() == 0) {
        return write(data);
      } else {
        auto pieces = kj::heapArrayBuilder<const ArrayPtr<const byte>>(moreData.size() + 1);
        pieces.add(data);
        pieces.addAll(moreData);
        return write(pieces.finish());
      }
    }